

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O1

void shift128RightJamming(uint64_t a0,uint64_t a1,int count,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  byte bVar1;
  byte bVar2;
  
  if (count != 0) {
    bVar2 = (byte)count;
    bVar1 = -bVar2 & 0x3f;
    if (count < 0x40) {
      a1 = (ulong)(a1 << bVar1 != 0) | a1 >> (bVar2 & 0x3f) | a0 << bVar1;
      a0 = a0 >> (bVar2 & 0x3f);
    }
    else {
      if (count == 0x40) {
        a1 = a1 != 0 | a0;
      }
      else if (count < 0x80) {
        a1 = (ulong)(a0 << bVar1 != 0 || a1 != 0) | a0 >> (bVar2 & 0x3f);
      }
      else {
        a1 = (uint64_t)(a1 != 0 || a0 != 0);
      }
      a0 = 0;
    }
  }
  *z1Ptr = a1;
  *z0Ptr = a0;
  return;
}

Assistant:

static inline void
 shift128RightJamming(
     uint64_t a0, uint64_t a1, int count, uint64_t *z0Ptr, uint64_t *z1Ptr)
{
    uint64_t z0, z1;
    int8_t negCount = ( - count ) & 63;

    if ( count == 0 ) {
        z1 = a1;
        z0 = a0;
    }
    else if ( count < 64 ) {
        z1 = ( a0<<negCount ) | ( a1>>count ) | ( ( a1<<negCount ) != 0 );
        z0 = a0>>count;
    }
    else {
        if ( count == 64 ) {
            z1 = a0 | ( a1 != 0 );
        }
        else if ( count < 128 ) {
            z1 = ( a0>>( count & 63 ) ) | ( ( ( a0<<negCount ) | a1 ) != 0 );
        }
        else {
            z1 = ( ( a0 | a1 ) != 0 );
        }
        z0 = 0;
    }
    *z1Ptr = z1;
    *z0Ptr = z0;

}